

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall adios2::core::engine::ssc::SscWriterGeneric::EndStepFirst(SscWriterGeneric *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  long in_RDI;
  bool in_stack_0000015f;
  SscWriterGeneric *in_stack_00000160;
  SscWriterGeneric *in_stack_000001a0;
  
  SyncWritePattern(in_stack_00000160,in_stack_0000015f);
  puVar1 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
  sVar2 = Buffer::size((Buffer *)(in_RDI + 0x38));
  MPI_Win_create(puVar1,sVar2,1,&ompi_mpi_info_null,*(undefined8 *)(in_RDI + 0x10),in_RDI + 200);
  MPI_Win_free(in_RDI + 200);
  SyncReadPattern(in_stack_000001a0);
  return;
}

Assistant:

void SscWriterGeneric::EndStepFirst()
{
    SyncWritePattern();
    MPI_Win_create(m_Buffer.data(), m_Buffer.size(), 1, MPI_INFO_NULL, m_StreamComm, &m_MpiWin);
    MPI_Win_free(&m_MpiWin);
    SyncReadPattern();
}